

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O1

int comex_group_translate_world(comex_group_t group,int group_rank,int *world_rank)

{
  undefined4 in_EAX;
  int code;
  comex_igroup_t *pcVar1;
  comex_igroup_t *pcVar2;
  undefined8 in_R9;
  undefined8 uVar3;
  
  uVar3 = CONCAT44(group_rank,in_EAX);
  if (group == 0) {
    *world_rank = group_rank;
  }
  else {
    pcVar1 = comex_get_igroup_from_group(group);
    pcVar2 = comex_get_igroup_from_group(0);
    code = MPI_Group_translate_ranks
                     (pcVar1->group,1,&stack0xffffffffffffffec,pcVar2->group,world_rank,in_R9,uVar3)
    ;
    if (code != 0) {
      comex_error("MPI_Group_translate_ranks: Failed ",code);
    }
  }
  return 0;
}

Assistant:

int comex_group_translate_world(comex_group_t group, int group_rank, int *world_rank)
{
    if (COMEX_GROUP_WORLD == group) {
        *world_rank = group_rank;
    }
    else {
        comex_igroup_t *igroup = comex_get_igroup_from_group(group);
        comex_igroup_t *world_igroup = comex_get_igroup_from_group(COMEX_GROUP_WORLD);
        int status = MPI_Group_translate_ranks(
                igroup->group, 1, &group_rank, world_igroup->group, world_rank);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Group_translate_ranks: Failed ", status);
        }
    }

    return COMEX_SUCCESS;
}